

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O2

string * cmCurlFixFileURL(string *__return_storage_ptr__,string *url)

{
  bool bVar1;
  string_view str;
  
  str._M_str = (url->_M_dataplus)._M_p;
  str._M_len = url->_M_string_length;
  bVar1 = cmHasLiteralPrefix<8ul>(str,(char (*) [8])"file://");
  if (bVar1) {
    cmsys::SystemTools::ReplaceString(url," ","%20");
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)url);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCurlFixFileURL(std::string url)
{
  if (!cmHasLiteralPrefix(url, "file://")) {
    return url;
  }

  // libcurl 7.77 and below accidentally allowed spaces in URLs in some cases.
  // One such case was file:// URLs, which CMake has long accepted as a result.
  // Explicitly encode spaces for a URL.
  cmSystemTools::ReplaceString(url, " ", "%20");

#if defined(_WIN32)
  // libcurl doesn't support file:// urls for unicode filenames on Windows.
  // Convert string from UTF-8 to ACP if this is a file:// URL.
  std::wstring wurl = cmsys::Encoding::ToWide(url);
  if (!wurl.empty()) {
    int mblen =
      WideCharToMultiByte(CP_ACP, 0, wurl.c_str(), -1, NULL, 0, NULL, NULL);
    if (mblen > 0) {
      std::vector<char> chars(mblen);
      mblen = WideCharToMultiByte(CP_ACP, 0, wurl.c_str(), -1, &chars[0],
                                  mblen, NULL, NULL);
      if (mblen > 0) {
        url = &chars[0];
      }
    }
  }
#endif

  return url;
}